

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString addMarkerToString(SimpleString *str,int markerPos)

{
  size_t sVar1;
  SimpleString *this;
  char *bufferToCopy;
  int in_EDX;
  size_t extraout_RDX;
  SimpleString *in_RDI;
  SimpleString SVar2;
  char *buffer;
  size_t bufferSize;
  SimpleString *result;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  sVar1 = SimpleString::size((SimpleString *)0x1798f9);
  this = (SimpleString *)(sVar1 + 1);
  bufferToCopy = (char *)(*PlatformSpecificMalloc)((size_t)this);
  SimpleString::copyToBuffer
            (this,bufferToCopy,CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  bufferToCopy[in_EDX] = '^';
  SimpleString::SimpleString(in_RDI,in_stack_ffffffffffffffa8);
  (*PlatformSpecificFree)(bufferToCopy);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

static SimpleString addMarkerToString(const SimpleString& str, int markerPos)
{
    size_t bufferSize = str.size()+1;
    char* buffer = (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);

    buffer[markerPos] = '^';

    SimpleString result(buffer);
    PlatformSpecificFree(buffer);
    return result;

}